

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_xpairs(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  TRef TVar3;
  long in_RSI;
  long in_RDI;
  undefined4 unaff_retaddr;
  TRef tr;
  MMS in_stack_0000003c;
  RecordFFData *in_stack_00000040;
  jit_State *in_stack_00000048;
  TRef local_18;
  
  uVar1 = **(uint **)(in_RDI + 0x88);
  if ((((uVar1 & 0x1f000000) != 0xa000000) ||
      (iVar2 = recff_metacall(in_stack_00000048,in_stack_00000040,in_stack_0000003c), iVar2 == 0))
     && ((uVar1 & 0x1f000000) == 0xb000000)) {
    TVar3 = lj_ir_kgc(J,(GCobj *)rd,tr);
    **(TRef **)(in_RDI + 0x88) = TVar3;
    *(uint *)(*(long *)(in_RDI + 0x88) + 4) = uVar1;
    if (*(int *)(in_RSI + 0x10) == 0) {
      local_18 = 0x7fff;
    }
    else {
      local_18 = lj_ir_kint((jit_State *)CONCAT44(tr,unaff_retaddr),(int32_t)((ulong)in_RDI >> 0x20)
                           );
    }
    *(TRef *)(*(long *)(in_RDI + 0x88) + 8) = local_18;
    *(undefined8 *)(in_RSI + 8) = 3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpairs(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!((LJ_52 || (LJ_HASFFI && tref_iscdata(tr))) &&
	recff_metacall(J, rd, MM_pairs + rd->data))) {
    if (tref_istab(tr)) {
      J->base[0] = lj_ir_kfunc(J, funcV(&J->fn->c.upvalue[0]));
      J->base[1] = tr;
      J->base[2] = rd->data ? lj_ir_kint(J, 0) : TREF_NIL;
      rd->nres = 3;
    }  /* else: Interpreter will throw. */
  }
}